

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_info.cpp
# Opt level: O1

bool __thiscall duckdb::AlterInfo::IsAddPrimaryKey(AlterInfo *this)

{
  bool bVar1;
  pointer pCVar2;
  UniqueConstraint *this_00;
  
  if (((this->super_ParseInfo).field_0x9 == '\x01') && (this->field_0x71 == '\v')) {
    pCVar2 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
             operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                         *)(this + 1));
    if (pCVar2->type == UNIQUE) {
      pCVar2 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
               operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                           *)(this + 1));
      this_00 = Constraint::Cast<duckdb::UniqueConstraint>(pCVar2);
      bVar1 = UniqueConstraint::IsPrimaryKey(this_00);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool AlterInfo::IsAddPrimaryKey() const {
	if (type != AlterType::ALTER_TABLE) {
		return false;
	}

	auto &table_info = Cast<AlterTableInfo>();
	if (table_info.alter_table_type != AlterTableType::ADD_CONSTRAINT) {
		return false;
	}

	auto &constraint_info = table_info.Cast<AddConstraintInfo>();
	if (constraint_info.constraint->type != ConstraintType::UNIQUE) {
		return false;
	}

	auto &unique_info = constraint_info.constraint->Cast<UniqueConstraint>();
	if (!unique_info.IsPrimaryKey()) {
		return false;
	}

	return true;
}